

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MediaManager.cpp
# Opt level: O2

IDisk * __thiscall Disk::CreateDisk(Disk *this,ILoadingProgress *loading_progress,ILog *log)

{
  IDisk *pIVar1;
  int iVar2;
  pointer pSVar3;
  IDisk *disk;
  Disk *local_b8;
  ILoadingProgress *local_b0;
  vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_> list_item;
  vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_> local_90;
  TrackItem item;
  vector<SingleElements,_std::allocator<SingleElements>_> list_elements;
  
  disk = (IDisk *)0x0;
  local_b8 = this;
  local_b0 = loading_progress;
  (*this->contained_element_->_vptr_IContainedElement[4])(&list_elements,this->contained_element_,3)
  ;
  list_item.super__Vector_base<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  list_item.super__Vector_base<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  list_item.super__Vector_base<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (pSVar3 = list_elements.super__Vector_base<SingleElements,_std::allocator<SingleElements>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pSVar3 != list_elements.super__Vector_base<SingleElements,_std::allocator<SingleElements>_>.
                _M_impl.super__Vector_impl_data._M_finish; pSVar3 = pSVar3 + 1) {
    item.path._M_string_length = 0;
    item.path.field_2._M_local_buf[0] = '\0';
    item.buffer = pSVar3->buffer_;
    item.size = (size_t)pSVar3->size_;
    item.path._M_dataplus._M_p = (pointer)&item.path.field_2;
    std::__cxx11::string::assign((char *)&item.path);
    std::vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_>::push_back
              (&list_item,&item);
    std::__cxx11::string::~string((string *)&item.path);
  }
  std::vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_>::vector
            (&local_90,&list_item);
  iVar2 = DiskBuilder::LoadDisk(&local_b8->disk_builder_,&local_90,&disk,local_b0);
  std::vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_>::~vector(&local_90);
  if (iVar2 == 0) {
    IDisk::SetName(disk,(list_elements.
                         super__Vector_base<SingleElements,_std::allocator<SingleElements>_>._M_impl
                         .super__Vector_impl_data._M_start)->filename_);
  }
  pIVar1 = disk;
  std::vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_>::~vector(&list_item);
  std::_Vector_base<SingleElements,_std::allocator<SingleElements>_>::~_Vector_base
            (&list_elements.super__Vector_base<SingleElements,_std::allocator<SingleElements>_>);
  return pIVar1;
}

Assistant:

IDisk* Disk::CreateDisk(ILoadingProgress* loading_progress, ILog* log)
{
   IDisk* disk = nullptr;

   std::vector<SingleElements> list_elements = contained_element_->GetInnerElements(3);
   std::vector<FormatType::TrackItem> list_item;
   for (auto& list_element : list_elements)
   {
      FormatType::TrackItem item;
      item.buffer = list_element.buffer_;
      item.size = list_element.size_;
      item.path = list_element.filename_;
      list_item.push_back(item);
   }


   if (disk_builder_.LoadDisk(list_item, disk, loading_progress) == 0)
   {
      disk->SetName(list_elements[0].filename_);
   }
   return disk;
}